

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgettextcontrol.cpp
# Opt level: O0

void __thiscall
QWidgetTextControlPrivate::selectionChanged
          (QWidgetTextControlPrivate *this,bool forceEmitSelectionChanged)

{
  bool bVar1;
  byte bVar2;
  int iVar3;
  QObject *pQVar4;
  ulong uVar5;
  byte in_SIL;
  QWidgetTextControlPrivate *in_RDI;
  long in_FS_OFFSET;
  bool selectionStateChange;
  QWidgetTextControl *q;
  QAccessibleTextSelectionEvent ev_1;
  QAccessibleTextSelectionEvent ev;
  undefined8 in_stack_ffffffffffffff58;
  undefined1 _t1;
  QObject *in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  QAccessibleTextSelectionEvent local_58 [40];
  QAccessibleTextSelectionEvent local_30 [40];
  long local_8;
  
  _t1 = (undefined1)((ulong)in_stack_ffffffffffffff58 >> 0x38);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  q_func(in_RDI);
  if ((in_SIL & 1) != 0) {
    QWidgetTextControl::selectionChanged((QWidgetTextControl *)0x70f833);
    pQVar4 = QObject::parent((QObject *)0x70f83d);
    if (pQVar4 != (QObject *)0x0) {
      QObject::parent((QObject *)0x70f851);
      bVar1 = QObject::isWidgetType((QObject *)0x70f859);
      if (bVar1) {
        memset(local_30,0xaa,0x28);
        in_stack_ffffffffffffff70 = QObject::parent((QObject *)0x70f87d);
        in_stack_ffffffffffffff7c = QTextCursor::anchor();
        QTextCursor::position();
        QAccessibleTextSelectionEvent::QAccessibleTextSelectionEvent
                  ((QAccessibleTextSelectionEvent *)in_RDI,
                   (QObject *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                   (int)((ulong)in_stack_ffffffffffffff70 >> 0x20),(int)in_stack_ffffffffffffff70);
        QAccessible::updateAccessibility((QAccessibleEvent *)local_30);
        QAccessibleTextSelectionEvent::~QAccessibleTextSelectionEvent(local_30);
      }
    }
  }
  iVar3 = QTextCursor::position();
  if ((iVar3 != in_RDI->lastSelectionPosition) ||
     (iVar3 = QTextCursor::anchor(), iVar3 != in_RDI->lastSelectionAnchor)) {
    bVar2 = QTextCursor::hasSelection();
    bVar1 = (bool)(bVar2 & 1) != (in_RDI->lastSelectionPosition != in_RDI->lastSelectionAnchor);
    if (bVar1) {
      QTextCursor::hasSelection();
      QWidgetTextControl::copyAvailable((QWidgetTextControl *)0x70f981,(bool)_t1);
    }
    if (((in_SIL & 1) == 0) &&
       ((bVar1 || ((uVar5 = QTextCursor::hasSelection(), (uVar5 & 1) != 0 &&
                   ((iVar3 = QTextCursor::position(), iVar3 != in_RDI->lastSelectionPosition ||
                    (iVar3 = QTextCursor::anchor(), iVar3 != in_RDI->lastSelectionAnchor)))))))) {
      QWidgetTextControl::selectionChanged((QWidgetTextControl *)0x70f9f7);
      pQVar4 = QObject::parent((QObject *)0x70fa01);
      if (pQVar4 != (QObject *)0x0) {
        QObject::parent((QObject *)0x70fa15);
        bVar1 = QObject::isWidgetType((QObject *)0x70fa1d);
        if (bVar1) {
          memset(local_58,0xaa,0x28);
          QObject::parent((QObject *)0x70fa41);
          QTextCursor::anchor();
          QTextCursor::position();
          QAccessibleTextSelectionEvent::QAccessibleTextSelectionEvent
                    ((QAccessibleTextSelectionEvent *)in_RDI,
                     (QObject *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                     (int)((ulong)in_stack_ffffffffffffff70 >> 0x20),(int)in_stack_ffffffffffffff70)
          ;
          QAccessible::updateAccessibility((QAccessibleEvent *)local_58);
          QAccessibleTextSelectionEvent::~QAccessibleTextSelectionEvent(local_58);
        }
      }
    }
    QWidgetTextControl::microFocusChanged((QWidgetTextControl *)0x70fa9f);
    iVar3 = QTextCursor::position();
    in_RDI->lastSelectionPosition = iVar3;
    iVar3 = QTextCursor::anchor();
    in_RDI->lastSelectionAnchor = iVar3;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QWidgetTextControlPrivate::selectionChanged(bool forceEmitSelectionChanged /*=false*/)
{
    Q_Q(QWidgetTextControl);
    if (forceEmitSelectionChanged) {
        emit q->selectionChanged();
#if QT_CONFIG(accessibility)
        if (q->parent() && q->parent()->isWidgetType()) {
            QAccessibleTextSelectionEvent ev(q->parent(), cursor.anchor(), cursor.position());
            QAccessible::updateAccessibility(&ev);
        }
#endif
    }

    if (cursor.position() == lastSelectionPosition
        && cursor.anchor() == lastSelectionAnchor)
        return;

    bool selectionStateChange = (cursor.hasSelection()
                                 != (lastSelectionPosition != lastSelectionAnchor));
    if (selectionStateChange)
        emit q->copyAvailable(cursor.hasSelection());

    if (!forceEmitSelectionChanged
        && (selectionStateChange
            || (cursor.hasSelection()
                && (cursor.position() != lastSelectionPosition
                    || cursor.anchor() != lastSelectionAnchor)))) {
        emit q->selectionChanged();
#if QT_CONFIG(accessibility)
        if (q->parent() && q->parent()->isWidgetType()) {
            QAccessibleTextSelectionEvent ev(q->parent(), cursor.anchor(), cursor.position());
            QAccessible::updateAccessibility(&ev);
        }
#endif
    }
    emit q->microFocusChanged();
    lastSelectionPosition = cursor.position();
    lastSelectionAnchor = cursor.anchor();
}